

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crypt.cpp
# Opt level: O0

int __thiscall
Decrypt::decrypt(Decrypt *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  _Map_pointer ppiVar1;
  SequenceD<64> local_658;
  SequenceD<64> local_5a8;
  undefined1 local_4f8 [8];
  DESinv d2;
  SequenceD<64> local_398;
  undefined1 local_2e8 [8];
  DES c;
  SequenceD<64> local_228;
  SequenceD<64> local_178;
  undefined1 local_c8 [8];
  DESinv d1;
  SequenceD<64> *seq_local;
  Decrypt *this_local;
  
  d1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)ctx;
  DESinv::DESinv((DESinv *)local_c8,&this->m_k1);
  SequenceD<64>::SequenceD
            (&local_228,
             (SequenceD<64> *)
             d1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node);
  DESinv::operator()(&local_178,(DESinv *)local_c8,&local_228);
  SequenceD<64>::operator=
            ((SequenceD<64> *)
             d1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node,&local_178);
  SequenceD<64>::~SequenceD(&local_178);
  SequenceD<64>::~SequenceD(&local_228);
  DES::DES((DES *)local_2e8,&this->m_k2);
  SequenceD<64>::SequenceD
            ((SequenceD<64> *)
             ((long)&d2.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data + 0x48),
             (SequenceD<64> *)
             d1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node);
  DES::operator()(&local_398,(DES *)local_2e8,
                  (SequenceD<64> *)
                  ((long)&d2.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>.
                          _M_impl.super__Deque_impl_data + 0x48));
  SequenceD<64>::operator=
            ((SequenceD<64> *)
             d1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node,&local_398);
  SequenceD<64>::~SequenceD(&local_398);
  SequenceD<64>::~SequenceD
            ((SequenceD<64> *)
             ((long)&d2.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data + 0x48));
  DESinv::DESinv((DESinv *)local_4f8,&this->m_k1);
  SequenceD<64>::SequenceD
            (&local_658,
             (SequenceD<64> *)
             d1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node);
  DESinv::operator()(&local_5a8,(DESinv *)local_4f8,&local_658);
  SequenceD<64>::operator=
            ((SequenceD<64> *)
             d1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node,&local_5a8);
  SequenceD<64>::~SequenceD(&local_5a8);
  SequenceD<64>::~SequenceD(&local_658);
  ppiVar1 = d1.m_key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  DESinv::~DESinv((DESinv *)local_4f8);
  DES::~DES((DES *)local_2e8);
  DESinv::~DESinv((DESinv *)local_c8);
  return (int)ppiVar1;
}

Assistant:

SequenceD<64> &Decrypt::decrypt(SequenceD<64> &seq) {
    DESinv d1(m_k1);
    seq = d1(seq);
    DES c(m_k2);
    seq = c(seq);
    DESinv d2(m_k1);
    seq = d2(seq);
    return seq;
}